

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall duckdb::ScanFilterInfo::~ScanFilterInfo(ScanFilterInfo *this)

{
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> __ptr;
  
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->base_column_has_filter);
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->column_has_filter);
  ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::~vector
            (&(this->filter_list).
              super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>);
  __ptr._M_head_impl =
       (this->adaptive_filter).
       super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
       super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
       .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (AdaptiveFilter *)0x0) {
    ::std::default_delete<duckdb::AdaptiveFilter>::operator()
              ((default_delete<duckdb::AdaptiveFilter> *)&this->adaptive_filter,__ptr._M_head_impl);
  }
  (this->adaptive_filter).
  super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>.
  super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> =
       (_Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>)0x0;
  return;
}

Assistant:

ScanFilterInfo::~ScanFilterInfo() {
}